

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Node::Node(Node *this,string *name,string *label,string *shape,string *extra)

{
  bool bVar1;
  reference pcVar2;
  char local_59;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_58;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  string *extra_local;
  string *shape_local;
  string *label_local;
  string *name_local;
  Node *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  std::__cxx11::string::string((string *)&this->label,(string *)label);
  std::__cxx11::string::string((string *)&this->shape,(string *)shape);
  std::__cxx11::string::string((string *)&this->extra,(string *)extra);
  std::__cxx11::string::operator=((string *)this,"");
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_58._M_current = (char *)std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffa8);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    local_59 = *pcVar2;
    if (local_59 == '#') {
      local_59 = '_';
    }
    std::__cxx11::string::operator+=((string *)this,local_59);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

Node::Node(const string &name, const string &label, const string &shape, const string &extra) : name(name),
                                                                                                label(label),
                                                                                                shape(shape),
                                                                                                extra(extra) {
    this->name = "";
    for (char c: name) {
        if (c == '#')
            c = '_';
        this->name += c;
    }
}